

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

uint nk_check_flags_text(nk_context *ctx,char *text,int len,uint flags,uint value)

{
  int iVar1;
  uint in_ECX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  int old_active;
  int in_stack_00000038;
  int in_stack_0000003c;
  char *in_stack_00000040;
  nk_context *in_stack_00000048;
  uint local_20;
  uint local_4;
  
  local_4 = in_ECX;
  if ((in_RDI != 0) && (in_RSI != 0)) {
    iVar1 = nk_check_text(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038);
    if (iVar1 == 0) {
      local_20 = (in_R8D ^ 0xffffffff) & in_ECX;
    }
    else {
      local_20 = in_R8D | in_ECX;
    }
    local_4 = local_20;
  }
  return local_4;
}

Assistant:

NK_API unsigned int
nk_check_flags_text(struct nk_context *ctx, const char *text, int len,
    unsigned int flags, unsigned int value)
{
    int old_active;
    NK_ASSERT(ctx);
    NK_ASSERT(text);
    if (!ctx || !text) return flags;
    old_active = (int)((flags & value) & value);
    if (nk_check_text(ctx, text, len, old_active))
        flags |= value;
    else flags &= ~value;
    return flags;
}